

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_make_sized(size_t nw)

{
  mp_int *pmVar1;
  
  pmVar1 = (mp_int *)safemalloc(1,0x10,nw * 8);
  if (nw != 0) {
    pmVar1->nw = nw;
    pmVar1->w = &pmVar1[1].nw;
    smemclr(pmVar1 + 1,nw * 8);
    return pmVar1;
  }
  __assert_fail("nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x48,"mp_int *mp_make_sized(size_t)");
}

Assistant:

mp_int *mp_make_sized(size_t nw)
{
    mp_int *x = snew_plus(mp_int, nw * sizeof(BignumInt));
    assert(nw);                   /* we outlaw the zero-word mp_int */
    x->nw = nw;
    x->w = snew_plus_get_aux(x);
    mp_clear(x);
    return x;
}